

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

double __thiscall
Problem_CGBG_FF::Likelihood
          (Problem_CGBG_FF *this,Index houseI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oVec_hI,Index fireLevel)

{
  uint uVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 1.0;
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(oVec_hI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(oVec_hI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(oVec_hI,(ulong)uVar1);
    dVar4 = FLObservationProb(this,fireLevel,*pvVar2);
    dVar3 = dVar3 * dVar4;
  }
  return dVar3;
}

Assistant:

double Problem_CGBG_FF::Likelihood(Index houseI, 
        const vector<Problem_CGBG_FF::observation_t>& oVec_hI, Index fireLevel) const
{
    double p = 1.0;
    for(Index i=0; i < oVec_hI.size(); i++)
    {
        Problem_CGBG_FF::observation_t obs = oVec_hI.at(i);
        double p_this_obs = FLObservationProb(fireLevel, obs);

        //cout << "Likelihood: P(obs|FL)="<<p_this_obs<<" for obs, " << obs <<", FL="<<fireLevel<<endl;
        p *= p_this_obs;
    }
    return p;
}